

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::DitheringTests::init(DitheringTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *this_00;
  undefined8 in_RAX;
  TestCaseGroup *this_01;
  char *extraout_RAX;
  char *pcVar1;
  DitheringCase *this_02;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  allocator<char> local_d1;
  TestNode *local_d0;
  ulong local_c8;
  TestCaseGroup *local_c0;
  char *local_b8;
  string caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (char *)CONCAT71((int7)((ulong)in_RAX >> 8),init()::caseColors);
  if (init()::caseColors == '\0') {
    pcVar1 = (char *)__cxa_guard_acquire(&init()::caseColors);
    if ((int)pcVar1 != 0) {
      init::caseColors[0].name = "white";
      init::caseColors[0].color.m_data[0] = _DAT_0166f110;
      init::caseColors[0].color.m_data[1] = _UNK_0166f114;
      init::caseColors[0].color.m_data[2] = _UNK_0166f118;
      init::caseColors[0].color.m_data[3] = _UNK_0166f11c;
      init::caseColors[1].name = "red";
      init::caseColors[1].color.m_data[0] = _DAT_01668fe0;
      init::caseColors[1].color.m_data[1] = _UNK_01668fe4;
      init::caseColors[1].color.m_data[2] = _UNK_01668fe8;
      init::caseColors[1].color.m_data[3] = _UNK_01668fec;
      init::caseColors[2].name = "green";
      init::caseColors[2].color.m_data[0] = _DAT_01668fd0;
      init::caseColors[2].color.m_data[1] = _UNK_01668fd4;
      init::caseColors[2].color.m_data[2] = _UNK_01668fd8;
      init::caseColors[2].color.m_data[3] = _UNK_01668fdc;
      init::caseColors[3].name = "blue";
      init::caseColors[3].color.m_data[0] = (float)DAT_0166f2e0;
      init::caseColors[3].color.m_data[1] = DAT_0166f2e0._4_4_;
      init::caseColors[3].color.m_data[2] = (float)DAT_0166f2e8;
      init::caseColors[3].color.m_data[3] = DAT_0166f2e8._4_4_;
      init::caseColors[4].name = "alpha";
      init::caseColors[4].color.m_data[0] = (float)DAT_0167ea40;
      init::caseColors[4].color.m_data[1] = DAT_0167ea40._4_4_;
      init::caseColors[4].color.m_data[2] = (float)DAT_0167ea48;
      init::caseColors[4].color.m_data[3] = DAT_0167ea48._4_4_;
      pcVar1 = (char *)__cxa_guard_release(&init()::caseColors);
    }
  }
  local_d0 = (TestNode *)this;
  for (iVar5 = 0; this_00 = local_d0, iVar5 != 2; iVar5 = iVar5 + 1) {
    this_01 = (TestCaseGroup *)operator_new(0x78);
    pcVar1 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
    if (iVar5 != 0) {
      pcVar1 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
    }
    TestCaseGroup::TestCaseGroup
              (this_01,(Context *)this_00[1]._vptr_TestNode,pcVar1 + 0x27,
               glcts::fixed_sample_locations_values + 1);
    local_c0 = this_01;
    tcu::TestNode::addChild(this_00,(TestNode *)this_01);
    uVar3 = 0;
    pcVar1 = extraout_RAX;
    while (iVar2 = (int)uVar3, iVar2 != 2) {
      local_b8 = (char *)0x0;
      if (iVar2 == 1) {
        local_b8 = "unicolored_quad";
      }
      pcVar1 = "gradient";
      if (iVar2 == 0) {
        local_b8 = "gradient";
      }
      local_c8 = uVar3;
      for (lVar4 = 0; lVar4 != 0x78; lVar4 = lVar4 + 0x18) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,glcts::fixed_sample_locations_values + 1,&local_d1);
        std::operator+(&local_50,&local_70,local_b8);
        std::operator+(&local_90,&local_50,"_");
        std::operator+(&caseName,&local_90,
                       *(char **)((long)init::caseColors[0].color.m_data + lVar4 + -8));
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        this_02 = (DitheringCase *)operator_new(0xb0);
        DitheringCase::DitheringCase
                  (this_02,(TestContext *)*local_d0[1]._vptr_TestNode,
                   (RenderContext *)local_d0[1]._vptr_TestNode[1],caseName._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,iVar5 != 0,(PatternType)local_c8,
                   (Vec4 *)((long)init::caseColors[0].color.m_data + lVar4));
        tcu::TestNode::addChild((TestNode *)local_c0,(TestNode *)this_02);
        pcVar1 = (char *)std::__cxx11::string::~string((string *)&caseName);
      }
      uVar3 = (ulong)((int)local_c8 + 1);
    }
  }
  return (int)pcVar1;
}

Assistant:

void DitheringTests::init (void)
{
	static const struct
	{
		const char*		name;
		Vec4			color;
	} caseColors[] =
	{
		{ "white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
		{ "red",		Vec4(1.0f, 0.0f, 0.0f, 1.0f) },
		{ "green",		Vec4(0.0f, 1.0f, 0.0f, 1.0f) },
		{ "blue",		Vec4(0.0f, 0.0f, 1.0f, 1.0f) },
		{ "alpha",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) }
	};

	for (int ditheringEnabledI = 0; ditheringEnabledI <= 1; ditheringEnabledI++)
	{
		const bool				ditheringEnabled	= ditheringEnabledI != 0;
		TestCaseGroup* const	group				= new TestCaseGroup(m_context, ditheringEnabled ? "enabled" : "disabled", "");
		addChild(group);

		for (int patternTypeI = 0; patternTypeI < DitheringCase::PATTERNTYPE_LAST; patternTypeI++)
		{
			for (int caseColorNdx = 0; caseColorNdx < DE_LENGTH_OF_ARRAY(caseColors); caseColorNdx++)
			{
				const DitheringCase::PatternType	patternType		= (DitheringCase::PatternType)patternTypeI;
				const string						caseName		= string("") + DitheringCase::getPatternTypeName(patternType) + "_" + caseColors[caseColorNdx].name;

				group->addChild(new DitheringCase(m_context.getTestContext(), m_context.getRenderContext(), caseName.c_str(), "", ditheringEnabled, patternType, caseColors[caseColorNdx].color));
			}
		}
	}
}